

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pr.cpp
# Opt level: O0

int pr_set_level(int level)

{
  int iVar1;
  undefined4 local_c;
  int old_level;
  int level_local;
  
  iVar1 = pr_level;
  if (level < 4) {
    local_c = level;
    if (level < 0) {
      local_c = 0;
    }
  }
  else {
    local_c = 3;
  }
  pr_level = local_c;
  return iVar1;
}

Assistant:

int pr_set_level(int level)
{
    if(level >  PR_LEVEL_DEBUG)
    {
        level = PR_LEVEL_DEBUG;
    }
    else if(level < PR_LEVEL_ERROR)
    {
        level = PR_LEVEL_ERROR;
    }

    int old_level = pr_level;
    pr_level = level;

    return old_level;
}